

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmGenericFunctionPrototype
                    (ExpressionContext *ctx,VmModule *module,ExprGenericFunctionPrototype *node)

{
  ExprVariableDefinition *expression;
  VmValue *pVVar1;
  IntrusiveList<ExprVariableDefinition> *pIVar2;
  
  pIVar2 = &node->contextVariables;
  while (expression = pIVar2->head, expression != (ExprVariableDefinition *)0x0) {
    CompileVm(ctx,module,&expression->super_ExprBase);
    pIVar2 = (IntrusiveList<ExprVariableDefinition> *)&(expression->super_ExprBase).next;
  }
  pVVar1 = anon_unknown.dwarf_f89de::CreateVoid(module);
  return pVVar1;
}

Assistant:

VmValue* CompileVmGenericFunctionPrototype(ExpressionContext &ctx, VmModule *module, ExprGenericFunctionPrototype *node)
{
	for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
		CompileVm(ctx, module, expr);

	return CreateVoid(module);
}